

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::handleBracketDereference
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *base,TIntermTyped *index)

{
  TIntermTyped *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TIntermTyped *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TConstUnionArray *this_00;
  TConstUnion *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar6;
  char *pcVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ulong uVar8;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  long lVar9;
  undefined4 extraout_var_18;
  TQualifier *pTVar10;
  undefined1 local_d8 [8];
  TType newType;
  int indexValue;
  bool flattened;
  TIntermTyped *result;
  TIntermTyped *index_local;
  TIntermTyped *base_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  index_local = base;
  base_local = (TIntermTyped *)loc;
  loc_local = (TSourceLoc *)this;
  pTVar5 = makeIntegerIndex(this,index);
  if (pTVar5 == (TIntermTyped *)0x0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,base_local," unknown index type ","");
    this_local = (HlslParseContext *)0x0;
  }
  else {
    _indexValue = (HlslParseContext *)
                  handleBracketOperator(this,(TSourceLoc *)base_local,index_local,pTVar5);
    this_local = _indexValue;
    if (_indexValue == (HlslParseContext *)0x0) {
      newType.spirvType._7_1_ = 0;
      newType.spirvType._0_4_ = 0;
      iVar3 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[0x21])();
      bVar2 = TQualifier::isFrontEndConstant((TQualifier *)CONCAT44(extraout_var,iVar3));
      if (bVar2) {
        iVar3 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[5])();
        this_00 = TIntermConstantUnion::getConstArray
                            ((TIntermConstantUnion *)CONCAT44(extraout_var_00,iVar3));
        this_01 = TConstUnionArray::operator[](this_00,0);
        newType.spirvType._0_4_ = TConstUnion::getIConst(this_01);
      }
      variableCheck(this,&index_local);
      uVar4 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x2a])();
      if ((((uVar4 & 1) == 0) &&
          (uVar4 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x29])(), (uVar4 & 1) == 0))
         && (uVar4 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x2b])(), (uVar4 & 1) == 0
            )) {
        iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0xc])();
        pTVar1 = base_local;
        if (CONCAT44(extraout_var_01,iVar3) == 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,base_local," left of \'[\' is not of type array, matrix, or vector ",
                     "expression","");
        }
        else {
          iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0xc])();
          pbVar6 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 400))();
          pcVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (pbVar6);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar1," left of \'[\' is not of type array, matrix, or vector ",pcVar7,""
                    );
        }
      }
      else {
        iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        pTVar10 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x58))();
        bVar2 = TQualifier::isFrontEndConstant(pTVar10);
        if (bVar2) {
          iVar3 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[0x21])();
          bVar2 = TQualifier::isFrontEndConstant((TQualifier *)CONCAT44(extraout_var_04,iVar3));
          pTVar1 = base_local;
          if (bVar2) {
            iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            TParseContextBase::checkIndex
                      (&this->super_TParseContextBase,(TSourceLoc *)pTVar1,
                       (TType *)CONCAT44(extraout_var_05,iVar3),(int *)&newType.spirvType);
            pTVar5 = TIntermediate::foldDereference
                               ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                index_local,(int)newType.spirvType,(TSourceLoc *)base_local);
            return pTVar5;
          }
        }
        iVar3 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[0x21])();
        bVar2 = TQualifier::isFrontEndConstant((TQualifier *)CONCAT44(extraout_var_06,iVar3));
        pTVar1 = base_local;
        if (bVar2) {
          iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          TParseContextBase::checkIndex
                    (&this->super_TParseContextBase,(TSourceLoc *)pTVar1,
                     (TType *)CONCAT44(extraout_var_07,iVar3),(int *)&newType.spirvType);
        }
        iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar3) + 200))();
        if ((uVar8 & 1) == 0) {
          iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0xc])();
          if ((CONCAT44(extraout_var_09,iVar3) == 0) ||
             (bVar2 = wasFlattened(this,index_local), !bVar2)) {
            iVar3 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[0x21])();
            bVar2 = TQualifier::isFrontEndConstant((TQualifier *)CONCAT44(extraout_var_12,iVar3));
            if (bVar2) {
              iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
              uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar3) + 0xf8))();
              pTVar1 = base_local;
              if ((uVar8 & 1) == 0) {
                iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
                TParseContextBase::checkIndex
                          (&this->super_TParseContextBase,(TSourceLoc *)pTVar1,
                           (TType *)CONCAT44(extraout_var_15,iVar3),(int *)&newType.spirvType);
              }
              else {
                iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1f])();
                (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar3) + 0x118))
                          ((long *)CONCAT44(extraout_var_14,iVar3),(int)newType.spirvType + 1);
              }
              _indexValue = (HlslParseContext *)
                            TIntermediate::addIndex
                                      ((this->super_TParseContextBase).super_TParseVersions.
                                       intermediate,EOpIndexDirect,index_local,pTVar5,
                                       (TSourceLoc *)base_local);
            }
            else {
              _indexValue = (HlslParseContext *)
                            TIntermediate::addIndex
                                      ((this->super_TParseContextBase).super_TParseVersions.
                                       intermediate,EOpIndexIndirect,index_local,pTVar5,
                                       (TSourceLoc *)base_local);
            }
          }
          else {
            iVar3 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[0x21])();
            pTVar1 = base_local;
            if (((uint)*(undefined8 *)(CONCAT44(extraout_var_10,iVar3) + 8) & 0x7f) != 2) {
              iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0xc])();
              pbVar6 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )(**(code **)(*(long *)CONCAT44(extraout_var_11,iVar3) + 400))();
              pcVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(pbVar6);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,pTVar1,"Invalid variable index to flattened array",pcVar7,"");
            }
            _indexValue = (HlslParseContext *)flattenAccess(this,index_local,(int)newType.spirvType)
            ;
            newType.spirvType._7_1_ = _indexValue != (HlslParseContext *)index_local;
          }
        }
        else {
          _indexValue = (HlslParseContext *)index_local;
        }
      }
      if (_indexValue == (HlslParseContext *)0x0) {
        _indexValue = (HlslParseContext *)
                      TIntermediate::addConstantUnion
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 0.0,EbtFloat,(TSourceLoc *)base_local,false);
      }
      else if ((newType.spirvType._7_1_ & 1) == 0) {
        iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        TType::TType((TType *)local_d8,(TType *)CONCAT44(extraout_var_16,iVar3),0,false);
        iVar3 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar3) + 0x58))();
        if ((((uint)*(undefined8 *)(lVar9 + 8) & 0x7f) == 2) &&
           (iVar3 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[0x21])(),
           ((uint)*(undefined8 *)(CONCAT44(extraout_var_18,iVar3) + 8) & 0x7f) == 2)) {
          pTVar10 = TType::getQualifier((TType *)local_d8);
          *(ulong *)&pTVar10->field_0x8 = *(ulong *)&pTVar10->field_0x8 & 0xffffffffffffff80 | 2;
        }
        else {
          pTVar10 = TType::getQualifier((TType *)local_d8);
          *(ulong *)&pTVar10->field_0x8 = *(ulong *)&pTVar10->field_0x8 & 0xffffffffffffff80;
        }
        (*(_indexValue->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1d])
                  (_indexValue,local_d8);
        TType::~TType((TType *)local_d8);
      }
      this_local = _indexValue;
    }
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::handleBracketDereference(const TSourceLoc& loc, TIntermTyped* base, TIntermTyped* index)
{
    index = makeIntegerIndex(index);

    if (index == nullptr) {
        error(loc, " unknown index type ", "", "");
        return nullptr;
    }

    TIntermTyped* result = handleBracketOperator(loc, base, index);

    if (result != nullptr)
        return result;  // it was handled as an operator[]

    bool flattened = false;
    int indexValue = 0;
    if (index->getQualifier().isFrontEndConstant())
        indexValue = index->getAsConstantUnion()->getConstArray()[0].getIConst();

    variableCheck(base);
    if (! base->isArray() && ! base->isMatrix() && ! base->isVector()) {
        if (base->getAsSymbolNode())
            error(loc, " left of '[' is not of type array, matrix, or vector ",
                  base->getAsSymbolNode()->getName().c_str(), "");
        else
            error(loc, " left of '[' is not of type array, matrix, or vector ", "expression", "");
    } else if (base->getType().getQualifier().isFrontEndConstant() &&
               index->getQualifier().isFrontEndConstant()) {
        // both base and index are front-end constants
        checkIndex(loc, base->getType(), indexValue);
        return intermediate.foldDereference(base, indexValue, loc);
    } else {
        // at least one of base and index is variable...

        if (index->getQualifier().isFrontEndConstant())
            checkIndex(loc, base->getType(), indexValue);

        if (base->getType().isScalarOrVec1())
            result = base;
        else if (base->getAsSymbolNode() && wasFlattened(base)) {
            if (index->getQualifier().storage != EvqConst)
                error(loc, "Invalid variable index to flattened array", base->getAsSymbolNode()->getName().c_str(), "");

            result = flattenAccess(base, indexValue);
            flattened = (result != base);
        } else {
            if (index->getQualifier().isFrontEndConstant()) {
                if (base->getType().isUnsizedArray())
                    base->getWritableType().updateImplicitArraySize(indexValue + 1);
                else
                    checkIndex(loc, base->getType(), indexValue);
                result = intermediate.addIndex(EOpIndexDirect, base, index, loc);
            } else
                result = intermediate.addIndex(EOpIndexIndirect, base, index, loc);
        }
    }

    if (result == nullptr) {
        // Insert dummy error-recovery result
        result = intermediate.addConstantUnion(0.0, EbtFloat, loc);
    } else {
        // If the array reference was flattened, it has the correct type.  E.g, if it was
        // a uniform array, it was flattened INTO a set of scalar uniforms, not scalar temps.
        // In that case, we preserve the qualifiers.
        if (!flattened) {
            // Insert valid dereferenced result
            TType newType(base->getType(), 0);  // dereferenced type
            if (base->getType().getQualifier().storage == EvqConst && index->getQualifier().storage == EvqConst)
                newType.getQualifier().storage = EvqConst;
            else
                newType.getQualifier().storage = EvqTemporary;
            result->setType(newType);
        }
    }

    return result;
}